

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<double> *original_costs,
            double cost_constant)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  init_policy_type iVar4;
  context *this_00;
  context *ctx;
  bool bVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  rep rVar11;
  undefined8 extraout_RAX;
  long lVar12;
  result_status rVar13;
  random_engine *rng;
  int iVar14;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  double *in_R9;
  long lVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar19 [16];
  double dVar18;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 extraout_var [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 in_XMM4_Qb;
  bit_array x;
  double ret;
  quadratic_cost_type<double> norm_costs;
  compute_order compute;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  slv;
  double local_1a0;
  bit_array_impl local_190;
  uint local_17c;
  double local_178;
  random_engine *local_170;
  quadratic_cost_type<double> *local_168;
  double local_160;
  ulong local_158;
  int local_14c;
  bit_array_impl local_148;
  double local_138;
  double local_130;
  double local_128;
  quadratic_cost_type<double> local_120;
  double local_100;
  double local_f8;
  compute_order local_f0;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  local_b8;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_160 = cost_constant;
  bit_array_impl::bit_array_impl(&local_190,variables);
  this_00 = this->m_ctx;
  normalize_costs<double,baryonyx::itm::quadratic_cost_type<double>>
            (&local_120,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<double> *)this->m_rng,(random_engine *)(ulong)(uint)variables,
             (int)in_R9);
  local_130 = (this_00->parameters).kappa_step;
  local_128 = (this_00->parameters).kappa_max;
  local_138 = (this_00->parameters).alpha;
  local_170 = (random_engine *)(this_00->parameters).theta;
  local_178 = (this_00->parameters).delta;
  if (local_178 < 0.0) {
    ctx = this->m_ctx;
    local_b8.rng = local_170;
    info<>(ctx,"  - delta not defined, compute it:\n");
    auVar22._0_8_ = (pointer)quadratic_cost_type<double>::min(&local_120,variables);
    auVar22._8_56_ = extraout_var;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_b8.rng;
    auVar1 = vfnmadd132sd_fma(auVar22._0_16_,auVar22._0_16_,auVar1);
    local_148._0_8_ = auVar1._0_8_;
    local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar22._0_8_;
    info<double,double,double>
              ((baryonyx *)ctx,(context *)"    - delta={} (min normalized cost:{} / theta: {})\n",
               (char *)&local_148,(double *)&local_f0,(double *)&local_b8,in_R9);
    local_178 = (double)local_148._0_8_;
  }
  local_f8 = (this_00->parameters).pushing_k_factor;
  local_100 = (this_00->parameters).pushing_objective_amplifier;
  local_158 = (ulong)(this_00->parameters).w;
  solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  ::solver_random_inequalities_101coeff
            (&local_b8,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_120,constraints);
  compute_order::compute_order(&local_f0,(this_00->parameters).order,variables);
  dVar18 = (this->m_ctx->parameters).init_policy_random;
  local_148._0_8_ = 0.0;
  local_148.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar4 = (this_00->parameters).init_policy;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>
              ((bit_array *)&local_190,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_190;
      x_optimistic = &local_148;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_0018ac61;
      rng = this->m_rng;
      x_pessimistic = &local_148;
      x_optimistic = &local_190;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::maximize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_0018ac61:
  local_168 = original_costs;
  if (local_190.m_size != 0) {
    iVar14 = 0;
    do {
      dVar17 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar17 < dVar18) {
        bit_array_impl::invert(&local_190,iVar14);
      }
      iVar14 = iVar14 + 1;
    } while (local_190.m_size != iVar14);
  }
  if (local_148.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_148.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  dVar18 = (this_00->parameters).kappa_min;
  rVar11 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar11;
  rVar11 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar11;
  compute_order::
  init<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
            (&local_f0,&local_b8,(bit_array *)&local_190);
  auVar22 = ZEXT864((ulong)dVar18);
  local_14c = variables;
  if ((this_00->parameters).limit == 0) {
    uVar8 = 0;
  }
  else {
    iVar14 = 0x7fffffff;
    lVar15 = 0;
    local_17c = 0;
    do {
      auVar19._0_8_ = auVar22._0_8_;
      iVar7 = compute_order::
              run<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array,double>
                        (&local_f0,&local_b8,(bit_array *)&local_190,this->m_rng,auVar19._0_8_,
                         local_178,(double)local_170);
      if (iVar7 == 0) {
        dVar18 = quadratic_cost_type<double>::results(local_168,(bit_array *)&local_190,local_160);
        store_if_better(this,(bit_array *)&local_190,dVar18,lVar15);
        local_17c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        iVar14 = 0;
        bVar5 = false;
        local_1a0 = auVar19._0_8_;
LAB_0018adc0:
        auVar22 = ZEXT864((ulong)local_1a0);
      }
      else {
        if (iVar7 < iVar14) {
          store_if_better(this,(bit_array *)&local_190,iVar7,lVar15);
          iVar14 = iVar7;
        }
        if ((long)local_158 < lVar15) {
          auVar23._0_8_ = pow((double)iVar7 / (double)local_b8.m,local_138);
          auVar23._8_56_ = extraout_var_00;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = auVar19._0_8_;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_130;
          auVar19 = vfmadd231sd_fma(auVar25,auVar23._0_16_,auVar2);
        }
        else {
          auVar19._8_8_ = 0;
        }
        auVar22 = ZEXT1664(auVar19);
        rVar13 = kappa_max_reached;
        local_1a0 = auVar19._0_8_;
        if (local_128 < local_1a0) {
LAB_0018ae22:
          __return_storage_ptr__->status = rVar13;
          bVar5 = false;
        }
        else {
          lVar12 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar12;
          dVar18 = (this->m_ctx->parameters).time_limit;
          bVar5 = true;
          if (dVar18 <= 0.0) goto LAB_0018adc0;
          rVar13 = time_limit_reached;
          auVar22 = ZEXT864((ulong)local_1a0);
          if (dVar18 < (double)(lVar12 - (this->m_begin).__d.__r) / 1000000000.0) goto LAB_0018ae22;
        }
      }
      uVar8 = local_17c;
    } while ((bVar5) && (lVar15 = lVar15 + 1, lVar15 != (this_00->parameters).limit));
  }
  if ((uVar8 & 1) == 0) {
    __return_storage_ptr__->status = limit_reached;
  }
  else if (0 < (this_00->parameters).pushes_limit) {
    iVar14 = 0;
    iVar7 = 0;
    do {
      local_1a0 = auVar22._0_8_;
      iVar9 = compute_order::
              push_and_run<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array,double>
                        (&local_f0,&local_b8,(bit_array *)&local_190,this->m_rng,
                         local_1a0 * local_f8,local_178,(double)local_170,local_100);
      if (iVar9 == 0) {
        dVar18 = quadratic_cost_type<double>::results(local_168,(bit_array *)&local_190,local_160);
        store_if_better(this,(bit_array *)&local_190,dVar18,
                        (long)~((this_00->parameters).pushing_iteration_limit * iVar7));
      }
      lVar15 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar15;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = (this->m_ctx->parameters).time_limit;
      auVar20._0_8_ = (double)(lVar15 - (this->m_begin).__d.__r) / 1000000000.0;
      auVar20._8_8_ = in_XMM4_Qb;
      uVar6 = vcmppd_avx512vl(auVar26,ZEXT816(0),6);
      uVar16 = vcmppd_avx512vl(auVar26,auVar20,1);
      uVar16 = ((byte)uVar6 & 3) & uVar16;
      local_158 = CONCAT62(local_158._2_6_,(short)uVar16);
      if ((uVar16 & 1) == 0) {
        auVar22 = ZEXT864((ulong)local_1a0);
        if (0 < (this_00->parameters).pushing_iteration_limit) {
          iVar9 = 1;
          do {
            auVar21._0_8_ = auVar22._0_8_;
            iVar10 = compute_order::
                     run<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array,double>
                               (&local_f0,&local_b8,(bit_array *)&local_190,this->m_rng,
                                auVar21._0_8_,local_178,(double)local_170);
            if (iVar10 == 0) {
              dVar18 = quadratic_cost_type<double>::results
                                 (local_168,(bit_array *)&local_190,local_160);
              store_if_better(this,(bit_array *)&local_190,dVar18,
                              (long)((this_00->parameters).pushing_iteration_limit * iVar14 - iVar9)
                             );
              auVar22 = ZEXT864((ulong)auVar21._0_8_);
              break;
            }
            if ((double)(iVar9 + -1) <= (this_00->parameters).w) {
              auVar21._8_8_ = 0;
            }
            else {
              auVar24._0_8_ = pow((double)iVar10 / (double)local_b8.m,local_138);
              auVar24._8_56_ = extraout_var_01;
              auVar27._8_8_ = 0;
              auVar27._0_8_ = auVar21._0_8_;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_130;
              auVar21 = vfmadd231sd_fma(auVar27,auVar24._0_16_,auVar3);
            }
            auVar22 = ZEXT1664(auVar21);
            local_1a0 = auVar21._0_8_;
            if (local_128 < local_1a0) break;
            lVar15 = std::chrono::_V2::steady_clock::now();
            (this->m_end).__d.__r = lVar15;
            dVar18 = (this->m_ctx->parameters).time_limit;
            if ((0.0 < dVar18) &&
               (dVar18 < (double)(lVar15 - (this->m_begin).__d.__r) / 1000000000.0))
            goto LAB_0018af21;
            auVar22 = ZEXT864((ulong)local_1a0);
            bVar5 = iVar9 < (this_00->parameters).pushing_iteration_limit;
            iVar9 = iVar9 + 1;
          } while (bVar5);
        }
      }
      else {
LAB_0018af21:
        auVar22 = ZEXT864((ulong)local_1a0);
      }
      if ((local_158 & 1) != 0) break;
      iVar7 = iVar7 + 1;
      iVar14 = iVar14 + -1;
    } while (iVar7 < (this_00->parameters).pushes_limit);
  }
  iVar14 = local_14c;
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::maximize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,iVar14);
  }
  if (local_f0.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
  ::~solver_random_inequalities_101coeff(&local_b8);
  if ((__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
      local_120.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0) {
    operator_delete__((void *)local_120.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_120.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if ((tuple<baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
       )local_120.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>)0x0) {
    operator_delete__((void *)local_120.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                              ._M_head_impl);
  }
  local_120.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>,_true,_true>
        )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
          )0x0;
  if ((_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)
      local_120.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (double *)0x0) {
    operator_delete__((void *)local_120.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_unsigned_long_*,_false>)
      local_190.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_190.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }